

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.c
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  double minunit_end_proc_timer;
  double minunit_end_real_timer;
  char **argv_local;
  int argc_local;
  
  writer_create_and_destroy();
  minunit_setup = (_func_void *)0x0;
  minunit_teardown = (_func_void *)0x0;
  writer_begin_and_end();
  minunit_setup = (_func_void *)0x0;
  minunit_teardown = (_func_void *)0x0;
  writer_buffer();
  minunit_setup = (_func_void *)0x0;
  minunit_teardown = (_func_void *)0x0;
  writer_status();
  minunit_setup = (_func_void *)0x0;
  minunit_teardown = (_func_void *)0x0;
  write_types();
  minunit_setup = (_func_void *)0x0;
  minunit_teardown = (_func_void *)0x0;
  arrays_and_maps();
  minunit_setup = (_func_void *)0x0;
  minunit_teardown = (_func_void *)0x0;
  data_helpers();
  minunit_setup = (_func_void *)0x0;
  minunit_teardown = (_func_void *)0x0;
  chunked_data();
  minunit_setup = (_func_void *)0x0;
  minunit_teardown = (_func_void *)0x0;
  printf("\n\n%d tests, %d assertions, %d failures\n",(ulong)(uint)minunit_run,
         (ulong)(uint)minunit_assert,(ulong)(uint)minunit_fail);
  dVar1 = mu_timer_real();
  dVar2 = mu_timer_cpu();
  printf("\nFinished in %.8f seconds (real) %.8f seconds (proc)\n\n",dVar1 - minunit_real_timer,
         dVar2 - minunit_proc_timer);
  return minunit_fail;
}

Assistant:

int 
main(int argc, char* argv[]) 
{
    MU_RUN_SUITE(writer_create_and_destroy);
    MU_RUN_SUITE(writer_begin_and_end);
    MU_RUN_SUITE(writer_buffer);
    MU_RUN_SUITE(writer_status);
    MU_RUN_SUITE(write_types);
    MU_RUN_SUITE(arrays_and_maps);
    MU_RUN_SUITE(data_helpers);
    MU_RUN_SUITE(chunked_data);
	MU_REPORT();
	return minunit_fail;
}